

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O3

int tostringbuff(TValue *obj,char *buff)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  lconv *plVar5;
  
  uVar1 = obj->tt_;
  if ((uVar1 & 0xf) != 3) {
    __assert_fail("(((((((obj))->tt_)) & 0x0F)) == (3))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                  ,0x177,"int tostringbuff(TValue *, char *)");
  }
  buff[0x12] = -0x55;
  buff[0x13] = -0x55;
  buff[0x14] = -0x55;
  buff[0x15] = -0x55;
  buff[0x16] = -0x55;
  buff[0x17] = -0x55;
  buff[0x18] = -0x55;
  buff[0x19] = -0x55;
  buff[0x1a] = -0x55;
  buff[0x1b] = -0x55;
  buff[0x1c] = -0x55;
  buff[0x1d] = -0x55;
  buff[0x1e] = -0x55;
  buff[0x1f] = -0x55;
  buff[0x20] = -0x55;
  buff[0x21] = -0x55;
  buff[0x22] = -0x55;
  buff[0x23] = -0x55;
  buff[0x24] = -0x55;
  buff[0x25] = -0x55;
  buff[0x26] = -0x55;
  buff[0x27] = -0x55;
  buff[0x28] = -0x55;
  buff[0x29] = -0x55;
  buff[0x2a] = -0x55;
  buff[0x2b] = -0x55;
  buff[0x2c] = -0x55;
  buff[0x2d] = -0x55;
  buff[0x2e] = -0x55;
  buff[0x2f] = -0x55;
  buff[0x30] = -0x55;
  buff[0x31] = -0x55;
  *buff = -0x55;
  buff[1] = -0x55;
  buff[2] = -0x55;
  buff[3] = -0x55;
  buff[4] = -0x55;
  buff[5] = -0x55;
  buff[6] = -0x55;
  buff[7] = -0x55;
  buff[8] = -0x55;
  buff[9] = -0x55;
  buff[10] = -0x55;
  buff[0xb] = -0x55;
  buff[0xc] = -0x55;
  buff[0xd] = -0x55;
  buff[0xe] = -0x55;
  buff[0xf] = -0x55;
  buff[0x10] = -0x55;
  buff[0x11] = -0x55;
  buff[0x12] = -0x55;
  buff[0x13] = -0x55;
  buff[0x14] = -0x55;
  buff[0x15] = -0x55;
  buff[0x16] = -0x55;
  buff[0x17] = -0x55;
  buff[0x18] = -0x55;
  buff[0x19] = -0x55;
  buff[0x1a] = -0x55;
  buff[0x1b] = -0x55;
  buff[0x1c] = -0x55;
  buff[0x1d] = -0x55;
  buff[0x1e] = -0x55;
  buff[0x1f] = -0x55;
  if (uVar1 == 0x13) {
    if (obj->tt_ == 0x13) {
      iVar2 = snprintf(buff,0x32,"%lld",(obj->value_).gc);
      return iVar2;
    }
    __assert_fail("((((obj))->tt_) == (((3) | ((1) << 4))))",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                  ,0x179,"int tostringbuff(TValue *, char *)");
  }
  if (obj->tt_ == 3) {
    iVar3 = snprintf(buff,0x32,"%.14g");
    sVar4 = strspn(buff,"-0123456789");
    iVar2 = iVar3;
    if (buff[sVar4] == '\0') {
      plVar5 = localeconv();
      iVar2 = iVar3 + 2;
      buff[iVar3] = *plVar5->decimal_point;
      buff[(long)iVar3 + 1] = '0';
    }
    return iVar2;
  }
  __assert_fail("((((obj))->tt_) == (((3) | ((0) << 4))))",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lobject.c"
                ,0x17b,"int tostringbuff(TValue *, char *)");
}

Assistant:

static int tostringbuff (TValue *obj, char *buff) {
  int len;
  lua_assert(ttisnumber(obj));
  if (ttisinteger(obj))
    len = lua_integer2str(buff, MAXNUMBER2STR, ivalue(obj));
  else {
    len = lua_number2str(buff, MAXNUMBER2STR, fltvalue(obj));
    if (buff[strspn(buff, "-0123456789")] == '\0') {  /* looks like an int? */
      buff[len++] = lua_getlocaledecpoint();
      buff[len++] = '0';  /* adds '.0' to result */
    }
  }
  return len;
}